

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex.cpp
# Opt level: O2

Complex * __thiscall Complex::inverse(Complex *__return_storage_ptr__,Complex *this)

{
  Rational *a;
  zero_division_error *this_00;
  Rational RStack_118;
  Rational local_d8;
  Rational sqmod;
  Rational local_58;
  
  ::operator*(&local_d8,&this->_re,&this->_re);
  a = &this->_im;
  ::operator*(&RStack_118,a,a);
  ::operator+(&sqmod,&local_d8,&RStack_118);
  Rational::~Rational(&RStack_118);
  Rational::~Rational(&local_d8);
  if (sqmod._numerator.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      sqmod._numerator.digits.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    operator/(&local_d8,&this->_re,&sqmod);
    Rational::operator-(&local_58,a);
    operator/(&RStack_118,&local_58,&sqmod);
    Complex(__return_storage_ptr__,&local_d8,&RStack_118);
    Rational::~Rational(&RStack_118);
    Rational::~Rational(&local_58);
    Rational::~Rational(&local_d8);
    Rational::~Rational(&sqmod);
    return __return_storage_ptr__;
  }
  this_00 = (zero_division_error *)__cxa_allocate_exception(0x10);
  zero_division_error::runtime_error(this_00,"Complex division by zero");
  __cxa_throw(this_00,&zero_division_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

const Complex Complex::inverse() const
{
    Rational sqmod = _re * _re + _im * _im;
    if(!sqmod)
        throw zero_division_error("Complex division by zero");
    return Complex(_re / sqmod, -_im / sqmod);
}